

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O0

size_t __thiscall
Problem_CGBG_FF::ComputeNumberOfAgentsPresentAtHouse
          (Problem_CGBG_FF *this,Index houseI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *a_vec)

{
  const_reference this_00;
  ulong __n;
  size_type sVar1;
  const_reference pvVar2;
  value_type in_ESI;
  vector<Scope,_std::allocator<Scope>_> *in_RDI;
  Index h;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *hs;
  Index acI;
  Index agI;
  Index i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *tupleOfAgents;
  size_t nrAgentsPresent;
  size_type in_stack_ffffffffffffffa8;
  undefined4 local_2c;
  undefined8 local_20;
  
  local_20 = 0;
  this_00 = std::vector<Scope,_std::allocator<Scope>_>::at(in_RDI,in_stack_ffffffffffffffa8);
  local_2c = 0;
  while( true ) {
    __n = (ulong)local_2c;
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this_00->super_SDT);
    if (sVar1 <= __n) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,__n);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,__n);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *)in_RDI,__n);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,__n);
    if (*pvVar2 == in_ESI) {
      local_20 = local_20 + 1;
    }
    local_2c = local_2c + 1;
  }
  return local_20;
}

Assistant:

size_t Problem_CGBG_FF::ComputeNumberOfAgentsPresentAtHouse(Index houseI, const vector<Index>& a_vec) const
{    
    size_t nrAgentsPresent = 0;
    const vector<Index> & tupleOfAgents = _m_agentsForHouse_action.at(houseI);
    for(Index i=0; i < tupleOfAgents.size(); i++)
    {
        Index agI = tupleOfAgents.at(i); //<-agent index
        Index acI = a_vec.at(i);      //<-its action

        const vector<Index>& hs = _m_houseIndices_action.at(agI);
        //cout << "agI="<<agI<<" hs=" << PrintTools::SoftPrintVector(hs)<<endl;
        Index h = hs.at(acI);

        if(h==houseI)
            nrAgentsPresent++;
    }
    //cout << "nrAgentsPresent="<<nrAgentsPresent<<endl;
    return nrAgentsPresent;

}